

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::SetFirstArgOffset(Func *this,Instr *inlineeStart)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  JITTimeFunctionBody *this_01;
  int iVar7;
  
  if (inlineeStart->m_func != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x301,"(inlineeStart->m_func == this)","inlineeStart->m_func == this");
    if (!bVar2) goto LAB_00409b6b;
    *puVar3 = 0;
  }
  if (this->parentFunc == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x302,"(!IsTopFunc())","!IsTopFunc()");
    if (!bVar2) goto LAB_00409b6b;
    *puVar3 = 0;
  }
  pIVar4 = IR::Instr::GetNextArg(inlineeStart);
  if (pIVar4 == (Instr *)0x0) {
    this_01 = GetJITFunctionBody(this->topFunc);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_01);
    iVar7 = -0x10;
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x318,"(this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode())",
                         "this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode()");
      if (!bVar2) goto LAB_00409b6b;
      *puVar3 = 0;
    }
  }
  else {
    pSVar5 = IR::Opnd::AsSymOpnd(pIVar4->m_dst);
    pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
    iVar7 = pSVar6->m_offset;
    if ((pSVar6->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x30a,"(lastArgOutStackSym->m_isSingleDef)",
                         "lastArgOutStackSym->m_isSingleDef");
      if (!bVar2) goto LAB_00409b6b;
      *puVar3 = 0;
    }
    this_00 = ((pSVar6->field_5).m_instrDef)->m_src2;
    bVar2 = IR::Opnd::IsSymOpnd(this_00);
    if (bVar2) {
      pSVar5 = IR::Opnd::AsSymOpnd(this_00);
      pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
      if (iVar7 < pSVar6->m_offset) {
        iVar7 = pSVar6->m_offset;
      }
    }
    iVar7 = iVar7 + -0x10;
  }
  iVar7 = iVar7 + (uint)this->actualCount * -8;
  if ((this->firstActualStackOffset != -1) && (this->firstActualStackOffset != iVar7)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x31c,
                       "((this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset))"
                       ,
                       "(this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset)"
                      );
    if (!bVar2) {
LAB_00409b6b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->firstActualStackOffset = iVar7;
  return;
}

Assistant:

void Func::SetFirstArgOffset(IR::Instr* inlineeStart)
{
    Assert(inlineeStart->m_func == this);
    Assert(!IsTopFunc());
    int32 lastOffset;

    IR::Instr* arg = inlineeStart->GetNextArg();
    if (arg)
    {
        const auto lastArgOutStackSym = arg->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        lastOffset = lastArgOutStackSym->m_offset;
        Assert(lastArgOutStackSym->m_isSingleDef);
        const auto secondLastArgOutOpnd = lastArgOutStackSym->m_instrDef->GetSrc2();
        if (secondLastArgOutOpnd->IsSymOpnd())
        {
            const auto secondLastOffset = secondLastArgOutOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset;
            if (secondLastOffset > lastOffset)
            {
                lastOffset = secondLastOffset;
            }
        }
        lastOffset += MachPtr;
    }
    else
    {
        Assert(this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode());
        lastOffset = MachPtr;
    }
    int32 firstActualStackOffset = lastOffset - ((this->actualCount + Js::Constants::InlineeMetaArgCount) * MachPtr);
    Assert((this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset));
    this->firstActualStackOffset = firstActualStackOffset;
}